

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_cosine_transform.cc
# Opt level: O0

void __thiscall
sptk::DiscreteCosineTransform::DiscreteCosineTransform(DiscreteCosineTransform *this,int dct_length)

{
  bool bVar1;
  int iVar2;
  reference pvVar3;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  __type __new_size;
  double dVar4;
  double dVar5;
  double dVar6;
  int i;
  double c;
  double argument;
  int dft_length;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_34;
  
  *in_RDI = &PTR__DiscreteCosineTransform_00129b38;
  *(undefined4 *)(in_RDI + 1) = in_ESI;
  FourierTransform::FourierTransform
            ((FourierTransform *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106d4a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106d5d);
  bVar1 = FourierTransform::IsValid((FourierTransform *)0x106d67);
  if (bVar1) {
    iVar2 = FourierTransform::GetLength((FourierTransform *)0x106dbb);
    dVar6 = (double)iVar2;
    __new_size = std::sqrt<int>(0);
    dVar4 = 1.0 / __new_size;
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
               (size_type)__new_size);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)CONCAT44(iVar2,in_stack_ffffffffffffffa0),
               (size_type)__new_size);
    dVar5 = sqrt(2.0);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),0);
    *pvVar3 = dVar4 / dVar5;
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 7),0);
    *pvVar3 = 0.0;
    for (local_34 = 1; local_34 < *(int *)(in_RDI + 1); local_34 = local_34 + 1) {
      dVar5 = cos((3.141592653589793 / dVar6) * (double)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 4),(long)local_34);
      *pvVar3 = dVar5 * dVar4;
      dVar5 = sin((3.141592653589793 / dVar6) * (double)local_34);
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 7),(long)local_34);
      *pvVar3 = -dVar5 * dVar4;
    }
  }
  return;
}

Assistant:

DiscreteCosineTransform::DiscreteCosineTransform(int dct_length)
    : dct_length_(dct_length), fourier_transform_(2 * dct_length_) {
  if (!fourier_transform_.IsValid()) {
    return;
  }

  const int dft_length(fourier_transform_.GetLength());
  const double argument(sptk::kPi / dft_length);
  const double c(1.0 / std::sqrt(dft_length));
  cosine_table_.resize(dct_length_);
  sine_table_.resize(dct_length_);
  cosine_table_[0] = c / std::sqrt(2.0);
  sine_table_[0] = 0.0;
  for (int i(1); i < dct_length_; ++i) {
    cosine_table_[i] = std::cos(argument * i) * c;
    sine_table_[i] = -std::sin(argument * i) * c;
  }
}